

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compression.cpp
# Opt level: O2

bool ZAP::compress(Compression compression,char **data,uint32_t in_size,uint32_t *out_size)

{
  int dstCapacity;
  uint32_t uVar1;
  char *dst;
  
  if (*data == (char *)0x0) {
    return false;
  }
  if (compression == LZ4) {
    dstCapacity = LZ4_compressBound(in_size);
    dst = (char *)operator_new__((long)dstCapacity);
    uVar1 = LZ4_compress_HC(*data,dst,in_size,dstCapacity,9);
    *out_size = uVar1;
    if (uVar1 == 0) {
      operator_delete__(dst);
      return false;
    }
    if (*data != (char *)0x0) {
      operator_delete__(*data);
    }
    *data = dst;
  }
  else {
    if (compression != NONE) {
      return false;
    }
    *out_size = in_size;
  }
  return true;
}

Assistant:

bool compress(Compression compression, char *&data, std::uint32_t in_size, std::uint32_t &out_size)
	{
		if (data == nullptr)
		{
			return false;
		}

		switch (compression)
		{
			case Compression::NONE:
			{
				out_size = in_size;
				return true;
			}
			#ifdef ZAP_COMPRESS_LZ4
			case Compression::LZ4:
			{
				int out_capacity = LZ4_compressBound(in_size);
				char *out_data = new char[out_capacity];
				out_size = LZ4_compress_HC(data, out_data, in_size, out_capacity, LZ4HC_CLEVEL_DEFAULT);
				if (out_size > 0)
				{
					delete[] data;
					data = out_data;
					return true;
				}
				else
				{
					delete[] out_data;
					return false;
				}
			}
			#endif
			default:
			{
				return false;
			}
		}
	}